

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_adapters.hpp
# Opt level: O0

void __thiscall
nlohmann::json_abi_v3_12_0::detail::
output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::output_adapter(output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_string_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_local;
  output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_18 = s;
  s_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::
  make_shared<nlohmann::json_abi_v3_12_0::detail::output_string_adapter<char,std::__cxx11::string>,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28);
  std::shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>>::
  shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_string_adapter<char,std::__cxx11::string>,void>
            ((shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>> *)this,
             &local_28);
  std::
  shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_string_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~shared_ptr(&local_28);
  return;
}

Assistant:

output_adapter(StringType& s)
        : oa(std::make_shared<output_string_adapter<CharType, StringType>>(s)) {}